

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

bool __thiscall QPDF::findEndstream(QPDF *this)

{
  InputSource *this_00;
  bool bVar1;
  bool bVar2;
  qpdf_offset_t qVar3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  Token t;
  
  readToken(&t,this,(((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x14);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"endobj",&local_c1);
  bVar1 = QPDFTokenizer::Token::isWord(&t,&local_c0);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"endstream",&local_c2);
    bVar2 = QPDFTokenizer::Token::isWord(&t,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar2 != false) {
    this_00 = (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar3 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar3,0);
  }
  QPDFTokenizer::Token::~Token(&t);
  return bVar2;
}

Assistant:

bool
QPDF::findEndstream()
{
    // Find endstream or endobj. Position the input at that token.
    auto t = readToken(*m->file, 20);
    if (t.isWord("endobj") || t.isWord("endstream")) {
        m->file->seek(m->file->getLastOffset(), SEEK_SET);
        return true;
    }
    return false;
}